

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O1

RROutput __thiscall
sf::priv::WindowImplX11::getOutputPrimary
          (WindowImplX11 *this,Window *rootWindow,XRRScreenResources *res,int xRandRMajor,
          int xRandRMinor)

{
  RROutput RVar1;
  
  if (((1 < xRandRMajor) || (xRandRMajor == 1 && 2 < xRandRMinor)) &&
     (RVar1 = XRRGetOutputPrimary(this->m_display,*rootWindow), RVar1 != 0)) {
    return RVar1;
  }
  return *res->outputs;
}

Assistant:

RROutput WindowImplX11::getOutputPrimary(::Window& rootWindow, XRRScreenResources* res, int xRandRMajor, int xRandRMinor)
{
    // if xRandR version >= 1.3 get the primary screen else take the first screen
    if ((xRandRMajor == 1 && xRandRMinor >= 3) || xRandRMajor > 1)
    {
        RROutput output = XRRGetOutputPrimary(m_display, rootWindow);

        // Check if returned output is valid, otherwise use the first screen
        if (output == None)
            return res->outputs[0];
        else
            return output;
    }

    // xRandr version can't get the primary screen, use the first screen
    return res->outputs[0];
}